

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupOutputVec(Gia_Man_t *p,Vec_Int_t *vOutPres)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  ulong uVar10;
  long lVar11;
  
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                  ,0x10c,"Gia_Man_t *Gia_ManDupOutputVec(Gia_Man_t *, Vec_Int_t *)");
  }
  if (p->vCos->nSize != vOutPres->nSize) {
    __assert_fail("Gia_ManPoNum(p) == Vec_IntSize(vOutPres)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                  ,0x10d,"Gia_Man_t *Gia_ManDupOutputVec(Gia_Man_t *, Vec_Int_t *)");
  }
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pName = pcVar7;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pSpec = pcVar7;
  p->pObjs->Value = 0;
  pVVar9 = p->vCis;
  uVar10 = (ulong)(uint)pVVar9->nSize;
  if (p->nRegs < pVVar9->nSize) {
    lVar11 = 0;
    do {
      if ((int)uVar10 <= lVar11) goto LAB_0066e89c;
      iVar1 = pVVar9->pArray[lVar11];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0066e87d;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar10 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar10 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar10 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) {
LAB_0066e8bb:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_0066e8bb;
      pGVar3[iVar1].Value = (int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * 0x55555556;
      lVar11 = lVar11 + 1;
      pVVar9 = p->vCis;
      uVar10 = (ulong)pVVar9->nSize;
    } while (lVar11 < (long)(uVar10 - (long)p->nRegs));
  }
  pVVar9 = p->vCos;
  uVar10 = (ulong)(uint)pVVar9->nSize;
  if (p->nRegs < pVVar9->nSize) {
    lVar11 = 0;
    do {
      if ((int)uVar10 <= lVar11) goto LAB_0066e89c;
      iVar1 = pVVar9->pArray[lVar11];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0066e87d;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (vOutPres->nSize <= lVar11) goto LAB_0066e89c;
      if (vOutPres->pArray[lVar11] != 0) {
        pGVar3 = p->pObjs + iVar1;
        Gia_ManDupOrderDfs_rec(p_00,p,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff));
      }
      lVar11 = lVar11 + 1;
      pVVar9 = p->vCos;
      uVar10 = (ulong)pVVar9->nSize;
    } while (lVar11 < (long)(uVar10 - (long)p->nRegs));
  }
  pVVar9 = p->vCos;
  uVar10 = (ulong)(uint)pVVar9->nSize;
  if (p->nRegs < pVVar9->nSize) {
    lVar11 = 0;
    do {
      if ((int)uVar10 <= lVar11) {
LAB_0066e89c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = pVVar9->pArray[lVar11];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_0066e87d:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return p_00;
      }
      if (vOutPres->nSize <= lVar11) goto LAB_0066e89c;
      if (vOutPres->pArray[lVar11] != 0) {
        pGVar3 = p->pObjs + iVar1;
        if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10f,"int Abc_LitNotCond(int, int)");
        }
        uVar5 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                     pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].
                                     Value);
        pGVar3->Value = uVar5;
      }
      lVar11 = lVar11 + 1;
      pVVar9 = p->vCos;
      uVar10 = (ulong)pVVar9->nSize;
    } while (lVar11 < (long)(uVar10 - (long)p->nRegs));
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupOutputVec( Gia_Man_t * p, Vec_Int_t * vOutPres )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManPoNum(p) == Vec_IntSize(vOutPres) );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachPo( p, pObj, i )
        if ( Vec_IntEntry(vOutPres, i) )
            Gia_ManDupOrderDfs_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        if ( Vec_IntEntry(vOutPres, i) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    return pNew;
}